

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::DCCorrection(double *input,double f0,int fs,int fft_size,double *output)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  double *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double *in_XMM0_Qa;
  double *unaff_retaddr;
  double in_stack_00000008;
  double in_stack_00000010;
  int i_1;
  int upper_limit_replica;
  int i;
  double *low_frequency_axis;
  double *low_frequency_replica;
  int upper_limit;
  int local_44;
  int local_3c;
  
  iVar3 = (int)(((double)in_XMM0_Qa * (double)in_EDX) / (double)in_ESI);
  iVar4 = iVar3 + 2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar5);
  for (local_3c = 0; local_3c < iVar4; local_3c = local_3c + 1) {
    *(double *)((long)pvVar7 + (long)local_3c * 8) =
         ((double)local_3c * (double)in_ESI) / (double)in_EDX;
  }
  interp1Q(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_XMM0_Qa
           ,in_ESI,in_RCX);
  for (local_44 = 0; local_44 < iVar3 + 1; local_44 = local_44 + 1) {
    in_RCX[local_44] =
         *(double *)(in_RDI + (long)local_44 * 8) + *(double *)((long)pvVar6 + (long)local_44 * 8);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    operator_delete__(pvVar7);
  }
  return;
}

Assistant:

void DCCorrection(const double *input, double f0, int fs, int fft_size,
    double *output) {
  int upper_limit = 2 + static_cast<int>(f0 * fft_size / fs);
  double *low_frequency_replica = new double[upper_limit];
  double *low_frequency_axis = new double[upper_limit];

  for (int i = 0; i < upper_limit; ++i)
    low_frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  int upper_limit_replica = upper_limit - 1;
  interp1Q(f0 - low_frequency_axis[0],
      -static_cast<double>(fs) / fft_size, input, upper_limit + 1,
      low_frequency_axis, upper_limit_replica, low_frequency_replica);

  for (int i = 0; i < upper_limit_replica; ++i)
    output[i] = input[i] + low_frequency_replica[i];

  delete[] low_frequency_replica;
  delete[] low_frequency_axis;
}